

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serverbrowser_filter.cpp
# Opt level: O3

int __thiscall
CServerBrowserFilter::AddFilter(CServerBrowserFilter *this,CServerFilterInfo *pFilterInfo)

{
  int iVar1;
  char *pcVar2;
  long lVar3;
  long in_FS_OFFSET;
  CServerFilter local_f8;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  pcVar2 = local_f8.m_FilterInfo.m_aGametypeExclusive;
  local_f8.m_pServerBrowserFilter = (CServerBrowserFilter *)0x0;
  local_f8.m_FilterInfo.m_SortHash = 0;
  local_f8.m_FilterInfo.m_Ping = 0;
  local_f8.m_FilterInfo.m_Country = 0;
  local_f8.m_FilterInfo.m_ServerLevel = 0;
  lVar3 = 0x18;
  do {
    *(undefined1 *)((long)(local_f8.m_FilterInfo.m_aGametype + -2) + 8 + lVar3) = 0;
    *pcVar2 = '\0';
    lVar3 = lVar3 + 0x10;
    pcVar2 = pcVar2 + 1;
  } while (lVar3 != 0x98);
  local_f8.m_FilterInfo.m_aAddress[0] = '\0';
  local_f8.m_NumSortedPlayers = 0;
  local_f8.m_NumSortedServers = 0;
  local_f8.m_pSortedServerlist = (int *)0x0;
  local_f8.m_SortedServersCapacity = 0;
  CServerFilterInfo::Set(&local_f8.m_FilterInfo,pFilterInfo);
  local_f8.m_NumSortedPlayers = 0;
  local_f8.m_NumSortedServers = 0;
  local_f8.m_pSortedServerlist = (int *)0x0;
  local_f8.m_SortedServersCapacity = 0;
  local_f8.m_pServerBrowserFilter = this;
  array<CServerBrowserFilter::CServerFilter,_allocator_default<CServerBrowserFilter::CServerFilter>_>
  ::add(&this->m_lFilters,&local_f8);
  iVar1 = (this->m_lFilters).num_elements;
  CServerFilter::~CServerFilter(&local_f8);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return iVar1 + -1;
  }
  __stack_chk_fail();
}

Assistant:

int CServerBrowserFilter::AddFilter(const CServerFilterInfo *pFilterInfo)
{
	CServerFilter Filter;
	Filter.m_FilterInfo.Set(pFilterInfo);
	Filter.m_pSortedServerlist = 0;
	Filter.m_NumSortedPlayers = 0;
	Filter.m_NumSortedServers = 0;
	Filter.m_SortedServersCapacity = 0;
	Filter.m_pServerBrowserFilter = this;
	m_lFilters.add(Filter);

	return m_lFilters.size()-1;
}